

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

void ImportModuleNamespaces(ParseContext *ctx,Lexeme *pos,ByteCode *bCode)

{
  uint uVar1;
  SynNamespaceElement **ppSVar2;
  int iVar3;
  char *pcVar4;
  ExternNamespaceInfo *pEVar5;
  undefined4 extraout_var;
  size_t sVar6;
  undefined4 extraout_var_00;
  char *__s;
  Lexeme *begin;
  long lVar7;
  ulong uVar8;
  SynNamespaceElement *parent;
  TraceScope traceScope;
  TraceScope local_40;
  SynIdentifier *name;
  
  if (ImportModuleNamespaces(ParseContext&,Lexeme*,ByteCode*)::token == '\0') {
    iVar3 = __cxa_guard_acquire(&ImportModuleNamespaces(ParseContext&,Lexeme*,ByteCode*)::token);
    if (iVar3 != 0) {
      ImportModuleNamespaces::token = NULLC::TraceGetToken("parser","ImportModuleNamespaces");
      __cxa_guard_release(&ImportModuleNamespaces(ParseContext&,Lexeme*,ByteCode*)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_40,ImportModuleNamespaces::token);
  pcVar4 = FindSymbols(bCode);
  pEVar5 = FindFirstNamespace(bCode);
  if (bCode->namespaceCount != 0) {
    uVar8 = 0;
    do {
      __s = pcVar4 + pEVar5[uVar8].offsetToName;
      if (pEVar5[uVar8].parentHash == 0xffffffff) {
        parent = (SynNamespaceElement *)0x0;
      }
      else {
        uVar1 = (ctx->namespaceList).count;
        if (uVar1 != 0) {
          lVar7 = 0;
          do {
            parent = (ctx->namespaceList).data[lVar7];
            if (parent->fullNameHash == pEVar5[uVar8].parentHash) goto LAB_0011951c;
            lVar7 = lVar7 + 1;
          } while (uVar1 != (uint)lVar7);
        }
        parent = (SynNamespaceElement *)0x0;
LAB_0011951c:
        if (parent == (SynNamespaceElement *)0x0) {
          anon_unknown.dwarf_1613e::Stop(ctx,pos,"ERROR: namespace %s parent not found",__s);
        }
      }
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      name = (SynIdentifier *)CONCAT44(extraout_var,iVar3);
      if (ctx->currentLexeme <= ctx->firstLexeme) {
        __assert_fail("currentLexeme > firstLexeme",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                      ,0x19c,"Lexeme *ParseContext::Previous()");
      }
      begin = ctx->currentLexeme + -1;
      sVar6 = strlen(__s);
      SynBase::SynBase((SynBase *)name,4,begin,begin);
      (name->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002282a0;
      (name->name).begin = __s;
      (name->name).end = __s + sVar6;
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
      SynNamespaceElement::SynNamespaceElement
                ((SynNamespaceElement *)CONCAT44(extraout_var_00,iVar3),parent,name);
      uVar1 = (ctx->namespaceList).count;
      if (uVar1 == (ctx->namespaceList).max) {
        SmallArray<SynNamespaceElement_*,_32U>::grow(&ctx->namespaceList,uVar1);
      }
      ppSVar2 = (ctx->namespaceList).data;
      if (ppSVar2 == (SynNamespaceElement **)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<SynNamespaceElement *, 32>::push_back(const T &) [T = SynNamespaceElement *, N = 32]"
                     );
      }
      uVar1 = (ctx->namespaceList).count;
      (ctx->namespaceList).count = uVar1 + 1;
      ppSVar2[uVar1] = (SynNamespaceElement *)CONCAT44(extraout_var_00,iVar3);
      uVar8 = uVar8 + 1;
    } while (uVar8 < bCode->namespaceCount);
  }
  NULLC::TraceScope::~TraceScope(&local_40);
  return;
}

Assistant:

void ImportModuleNamespaces(ParseContext &ctx, Lexeme *pos, ByteCode *bCode)
{
	TRACE_SCOPE("parser", "ImportModuleNamespaces");

	char *symbols = FindSymbols(bCode);

	// Import namespaces
	ExternNamespaceInfo *namespaceList = FindFirstNamespace(bCode);

	for(unsigned i = 0; i < bCode->namespaceCount; i++)
	{
		ExternNamespaceInfo &ns = namespaceList[i];

		const char *name = symbols + ns.offsetToName;

		SynNamespaceElement *parent = NULL;

		if(ns.parentHash != ~0u)
		{
			for(unsigned k = 0; k < ctx.namespaceList.size(); k++)
			{
				if(ctx.namespaceList[k]->fullNameHash == ns.parentHash)
				{
					parent = ctx.namespaceList[k];
					break;
				}
			}

			if(!parent)
				Stop(ctx, pos, "ERROR: namespace %s parent not found", name);
		}

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), InplaceStr(name));

		ctx.namespaceList.push_back(new (ctx.get<SynNamespaceElement>()) SynNamespaceElement(parent, nameIdentifier));
	}
}